

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damerau_levenshtein.cpp
# Opt level: O3

void duckdb::DamerauLevenshteinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  long *plVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  anon_class_8_1_6971b95b aVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  reference vector;
  reference vector_00;
  long lVar10;
  long lVar11;
  UnifiedVectorFormat *pUVar12;
  long lVar13;
  Vector *this_00;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  long lVar16;
  UnifiedVectorFormat *pUVar17;
  ulong uVar18;
  undefined8 *puVar19;
  ulong uVar20;
  VectorType VVar21;
  undefined8 in_R8;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  undefined8 *puVar22;
  ulong uVar23;
  UnifiedVectorFormat *pUVar24;
  ulong uVar25;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  Vector *pVVar26;
  UnifiedVectorFormat *local_110;
  undefined8 *local_108;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar21 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar21);
    plVar3 = *(long **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      left.value.pointer.ptr = (char *)**(undefined8 **)(vector_00 + 0x20);
      left.value._0_8_ = (*(undefined8 **)(vector + 0x20))[1];
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = (*(undefined8 **)(vector_00 + 0x20))[1];
      lVar10 = BinaryLambdaWrapper::
               Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                         ((Vector *)**(undefined8 **)(vector + 0x20),left,right,in_R9,
                          in_stack_fffffffffffffee8);
      *plVar3 = lVar10;
      return;
    }
  }
  else {
    local_110 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      puVar22 = *(undefined8 **)(vector_00 + 0x20);
      lVar10 = *(long *)(vector + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        pVVar26 = result;
        duckdb::Vector::SetVectorType(VVar21);
        lVar4 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (local_110 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          uVar5 = *puVar22;
          uVar6 = puVar22[1];
          local_108 = (undefined8 *)(lVar10 + 8);
          pUVar24 = (UnifiedVectorFormat *)0x0;
          do {
            left_05.value.pointer.ptr = (char *)uVar5;
            left_05.value._0_8_ = *local_108;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = uVar6;
            lVar10 = BinaryLambdaWrapper::
                     Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                               ((Vector *)local_108[-1],left_05,right_05,in_R9,(idx_t)pVVar26);
            *(long *)(lVar4 + (long)pUVar24 * 8) = lVar10;
            pUVar24 = pUVar24 + 1;
            local_108 = local_108 + 2;
          } while (local_110 != pUVar24);
          return;
        }
        if (local_110 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar10 = lVar10 + 8;
        uVar18 = 0;
        pUVar24 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            pUVar12 = pUVar24 + 0x40;
            if (local_110 <= pUVar24 + 0x40) {
              pUVar12 = local_110;
            }
LAB_00726aba:
            pUVar17 = pUVar24;
            if (pUVar24 < pUVar12) {
              uVar5 = *puVar22;
              uVar6 = puVar22[1];
              puVar19 = (undefined8 *)((long)pUVar24 * 0x10 + lVar10);
              do {
                left_00.value.pointer.ptr = (char *)uVar5;
                left_00.value._0_8_ = *puVar19;
                right_00.value.pointer.ptr = (char *)in_R8;
                right_00.value._0_8_ = uVar6;
                lVar11 = BinaryLambdaWrapper::
                         Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   ((Vector *)puVar19[-1],left_00,right_00,in_R9,(idx_t)pVVar26);
                *(long *)(lVar4 + (long)pUVar24 * 8) = lVar11;
                pUVar24 = pUVar24 + 1;
                puVar19 = puVar19 + 2;
                pUVar17 = pUVar12;
                result = pVVar26;
              } while (pUVar12 != pUVar24);
            }
          }
          else {
            uVar25 = *(ulong *)(*(long *)(result + 0x28) + uVar18 * 8);
            pUVar12 = pUVar24 + 0x40;
            if (local_110 <= pUVar24 + 0x40) {
              pUVar12 = local_110;
            }
            pUVar17 = pUVar12;
            result = pVVar26;
            if (uVar25 != 0) {
              if (uVar25 == 0xffffffffffffffff) goto LAB_00726aba;
              pUVar17 = pUVar24;
              if (pUVar24 < pUVar12) {
                puVar19 = (undefined8 *)((long)pUVar24 * 0x10 + lVar10);
                uVar20 = 0;
                do {
                  if ((uVar25 >> (uVar20 & 0x3f) & 1) != 0) {
                    left_01.value.pointer.ptr = (char *)*puVar22;
                    left_01.value._0_8_ = *puVar19;
                    right_01.value.pointer.ptr = (char *)in_R8;
                    right_01.value._0_8_ = puVar22[1];
                    lVar11 = BinaryLambdaWrapper::
                             Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                       ((Vector *)puVar19[-1],left_01,right_01,in_R9,(idx_t)pVVar26)
                    ;
                    *(long *)(lVar4 + (long)pUVar24 * 8 + uVar20 * 8) = lVar11;
                  }
                  uVar20 = uVar20 + 1;
                  puVar19 = puVar19 + 2;
                  pUVar17 = pUVar12;
                  result = pVVar26;
                } while ((long)pUVar12 - (long)pUVar24 != uVar20);
              }
            }
          }
          uVar18 = uVar18 + 1;
          pUVar24 = pUVar17;
          if (uVar18 == (ulong)(local_110 + 0x3f) >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar10 = *(long *)(vector + 0x20);
          lVar4 = *(long *)(vector_00 + 0x20);
          pVVar26 = result;
          duckdb::Vector::SetVectorType(VVar21);
          lVar11 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (local_110 != (UnifiedVectorFormat *)0x0) {
              lVar13 = 0;
              do {
                left_10.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar13 * 2);
                left_10.value._0_8_ = *(undefined8 *)(lVar10 + 8 + lVar13 * 2);
                right_10.value.pointer.ptr = (char *)in_R8;
                right_10.value._0_8_ = *(undefined8 *)(lVar4 + 8 + lVar13 * 2);
                lVar16 = BinaryLambdaWrapper::
                         Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(lVar10 + lVar13 * 2),left_10,right_10,in_R9,
                                    (idx_t)pVVar26);
                *(long *)(lVar11 + lVar13) = lVar16;
                lVar13 = lVar13 + 8;
                local_110 = local_110 + -1;
              } while (local_110 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < local_110 + 0x3f) {
            uVar18 = 0;
            pUVar24 = (UnifiedVectorFormat *)0x0;
            do {
              lVar13 = *(long *)(result + 0x28);
              if (lVar13 == 0) {
                pUVar12 = pUVar24 + 0x40;
                if (local_110 <= pUVar24 + 0x40) {
                  pUVar12 = local_110;
                }
LAB_00726fb7:
                pUVar17 = pUVar24;
                if (pUVar24 < pUVar12) {
                  uVar25 = (long)pUVar24 << 4 | 8;
                  do {
                    left_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + -8 + uVar25);
                    left_06.value._0_8_ = *(undefined8 *)(lVar10 + uVar25);
                    right_06.value.pointer.ptr = (char *)in_R8;
                    right_06.value._0_8_ = *(undefined8 *)(lVar4 + uVar25);
                    lVar13 = BinaryLambdaWrapper::
                             Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                       (*(Vector **)(lVar10 + -8 + uVar25),left_06,right_06,in_R9,
                                        uVar18);
                    *(long *)(lVar11 + (long)pUVar24 * 8) = lVar13;
                    pUVar24 = pUVar24 + 1;
                    uVar25 = uVar25 + 0x10;
                    pUVar17 = pUVar12;
                  } while (pUVar12 != pUVar24);
                }
              }
              else {
                uVar25 = *(ulong *)(lVar13 + uVar18 * 8);
                pUVar12 = pUVar24 + 0x40;
                if (local_110 <= pUVar24 + 0x40) {
                  pUVar12 = local_110;
                }
                pUVar17 = pUVar12;
                if (uVar25 != 0) {
                  if (uVar25 == 0xffffffffffffffff) goto LAB_00726fb7;
                  pUVar17 = pUVar24;
                  if (pUVar24 < pUVar12) {
                    uVar23 = (long)pUVar24 << 4 | 8;
                    uVar20 = 0;
                    do {
                      if ((uVar25 >> (uVar20 & 0x3f) & 1) != 0) {
                        left_07.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + -8 + uVar23);
                        left_07.value._0_8_ = *(undefined8 *)(lVar10 + uVar23);
                        right_07.value.pointer.ptr = (char *)in_R8;
                        right_07.value._0_8_ = *(undefined8 *)(lVar4 + uVar23);
                        lVar13 = BinaryLambdaWrapper::
                                 Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                           (*(Vector **)(lVar10 + -8 + uVar23),left_07,right_07,
                                            in_R9,uVar18);
                        *(long *)(lVar11 + (long)pUVar24 * 8 + uVar20 * 8) = lVar13;
                      }
                      uVar20 = uVar20 + 1;
                      uVar23 = uVar23 + 0x10;
                      pUVar17 = pUVar12;
                    } while ((long)pUVar12 - (long)pUVar24 != uVar20);
                  }
                }
              }
              uVar18 = uVar18 + 1;
              pUVar24 = pUVar17;
            } while (uVar18 != (ulong)(local_110 + 0x3f) >> 6);
          }
        }
        else {
          pVVar26 = result;
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,local_110);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,local_110);
          duckdb::Vector::SetVectorType(VVar21);
          lVar10 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            if (local_110 != (UnifiedVectorFormat *)0x0) {
              lVar4 = *local_78;
              lVar11 = *local_c0;
              pUVar24 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar12 = pUVar24;
                if (lVar4 != 0) {
                  pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)pUVar24 * 4);
                }
                pUVar17 = pUVar24;
                if (lVar11 != 0) {
                  pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar11 + (long)pUVar24 * 4);
                }
                left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar17 * 0x10)
                ;
                left_02.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar12 * 0x10);
                right_02.value.pointer.ptr = (char *)in_R8;
                right_02.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar17 * 0x10);
                lVar13 = BinaryLambdaWrapper::
                         Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(local_70 + (long)pUVar12 * 0x10),left_02,right_02,
                                    in_R9,(idx_t)pVVar26);
                *(long *)(lVar10 + (long)pUVar24 * 8) = lVar13;
                pUVar24 = pUVar24 + 1;
              } while (local_110 != pUVar24);
            }
          }
          else if (local_110 != (UnifiedVectorFormat *)0x0) {
            lVar4 = *local_78;
            lVar11 = *local_c0;
            this_00 = pVVar26 + 0x30;
            pUVar24 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar12 = pUVar24;
              if (lVar4 != 0) {
                pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar4 + (long)pUVar24 * 4);
              }
              pUVar17 = pUVar24;
              if (lVar11 != 0) {
                pUVar17 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar11 + (long)pUVar24 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar12 >> 6) * 8) >> ((ulong)pUVar12 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar17 >> 6) * 8) >> ((ulong)pUVar17 & 0x3f) & 1)
                   != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar17 * 0x10)
                ;
                left_08.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar12 * 0x10);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar17 * 0x10);
                lVar13 = BinaryLambdaWrapper::
                         Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(local_70 + (long)pUVar12 * 0x10),left_08,right_08,
                                    in_R9,(idx_t)pVVar26);
                *(long *)(lVar10 + (long)pUVar24 * 8) = lVar13;
              }
              else {
                _Var15._M_head_impl = *(unsigned_long **)(pVVar26 + 0x28);
                if (_Var15._M_head_impl == (unsigned_long *)0x0) {
                  local_c8 = *(unsigned_long *)(pVVar26 + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var9 = p_Stack_d0;
                  uVar5 = local_d8;
                  local_d8 = 0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar26 + 0x38);
                  *(undefined8 *)(pVVar26 + 0x30) = uVar5;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar26 + 0x38) = p_Var9;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)this_00);
                  _Var15._M_head_impl =
                       (pTVar14->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(pVVar26 + 0x28) = _Var15._M_head_impl;
                }
                bVar8 = (byte)pUVar24 & 0x3f;
                _Var15._M_head_impl[(ulong)pUVar24 >> 6] =
                     _Var15._M_head_impl[(ulong)pUVar24 >> 6] &
                     (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              }
              pUVar24 = pUVar24 + 1;
            } while (local_110 != pUVar24);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        return;
      }
      puVar22 = *(undefined8 **)(vector + 0x20);
      lVar10 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        pVVar26 = result;
        duckdb::Vector::SetVectorType(VVar21);
        lVar4 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (local_110 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar7.result = (Vector *)*puVar22;
          uVar5 = puVar22[1];
          puVar22 = (undefined8 *)(lVar10 + 8);
          pUVar24 = (UnifiedVectorFormat *)0x0;
          do {
            left_09.value.pointer.ptr = (char *)puVar22[-1];
            left_09.value._0_8_ = uVar5;
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *puVar22;
            lVar10 = BinaryLambdaWrapper::
                     Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                               (aVar7,left_09,right_09,in_R9,(idx_t)pVVar26);
            *(long *)(lVar4 + (long)pUVar24 * 8) = lVar10;
            pUVar24 = pUVar24 + 1;
            puVar22 = puVar22 + 2;
          } while (local_110 != pUVar24);
          return;
        }
        if (local_110 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar10 = lVar10 + 8;
        pUVar24 = (UnifiedVectorFormat *)0x0;
        uVar18 = 0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            pUVar12 = pUVar24 + 0x40;
            if (local_110 <= pUVar24 + 0x40) {
              pUVar12 = local_110;
            }
LAB_00726d8b:
            pUVar17 = pUVar24;
            if (pUVar24 < pUVar12) {
              aVar7.result = (Vector *)*puVar22;
              uVar5 = puVar22[1];
              puVar19 = (undefined8 *)((long)pUVar24 * 0x10 + lVar10);
              do {
                left_03.value.pointer.ptr = (char *)puVar19[-1];
                left_03.value._0_8_ = uVar5;
                right_03.value.pointer.ptr = (char *)in_R8;
                right_03.value._0_8_ = *puVar19;
                lVar11 = BinaryLambdaWrapper::
                         Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (aVar7,left_03,right_03,in_R9,(idx_t)pVVar26);
                *(long *)(lVar4 + (long)pUVar24 * 8) = lVar11;
                pUVar24 = pUVar24 + 1;
                puVar19 = puVar19 + 2;
                pUVar17 = pUVar12;
                result = pVVar26;
              } while (pUVar12 != pUVar24);
            }
          }
          else {
            uVar25 = *(ulong *)(*(long *)(result + 0x28) + uVar18 * 8);
            pUVar12 = pUVar24 + 0x40;
            if (local_110 <= pUVar24 + 0x40) {
              pUVar12 = local_110;
            }
            pUVar17 = pUVar12;
            result = pVVar26;
            if (uVar25 != 0) {
              if (uVar25 == 0xffffffffffffffff) goto LAB_00726d8b;
              pUVar17 = pUVar24;
              if (pUVar24 < pUVar12) {
                puVar19 = (undefined8 *)((long)pUVar24 * 0x10 + lVar10);
                uVar20 = 0;
                do {
                  if ((uVar25 >> (uVar20 & 0x3f) & 1) != 0) {
                    left_04.value.pointer.ptr = (char *)puVar19[-1];
                    left_04.value._0_8_ = puVar22[1];
                    right_04.value.pointer.ptr = (char *)in_R8;
                    right_04.value._0_8_ = *puVar19;
                    lVar11 = BinaryLambdaWrapper::
                             Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                       ((Vector *)*puVar22,left_04,right_04,in_R9,(idx_t)pVVar26);
                    *(long *)(lVar4 + (long)pUVar24 * 8 + uVar20 * 8) = lVar11;
                  }
                  uVar20 = uVar20 + 1;
                  puVar19 = puVar19 + 2;
                  pUVar17 = pUVar12;
                  result = pVVar26;
                } while ((long)pUVar12 - (long)pUVar24 != uVar20);
              }
            }
          }
          pUVar24 = pUVar17;
          uVar18 = uVar18 + 1;
          if (uVar18 == (ulong)(local_110 + 0x3f) >> 6) {
            return;
          }
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar21);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DamerauLevenshteinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &source_vec = args.data[0];
	auto &target_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, int64_t>(
	    source_vec, target_vec, result, args.size(),
	    [&](string_t source, string_t target) { return DamerauLevenshteinScalarFunction(result, source, target); });
}